

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_postsolve(void *highs,double *col_value,double *col_dual,double *row_dual)

{
  int iVar1;
  int iVar2;
  HighsStatus HVar3;
  size_type sVar4;
  size_type sVar5;
  size_type __new_size;
  HighsSolution solution;
  HighsSolution local_98;
  
  iVar1 = *(int *)((long)highs + 0x538);
  sVar5 = (size_type)iVar1;
  iVar2 = *(int *)((long)highs + 0x53c);
  __new_size = (size_type)iVar2;
  local_98.value_valid = false;
  local_98.dual_valid = false;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (col_value != (double *)0x0) {
    local_98.value_valid = true;
    local_98.dual_valid = false;
    std::vector<double,_std::allocator<double>_>::resize(&local_98.col_value,sVar5);
    std::vector<double,_std::allocator<double>_>::resize(&local_98.row_value,__new_size);
  }
  if (col_dual != (double *)0x0 || row_dual != (double *)0x0) {
    local_98.dual_valid = true;
    if (col_dual != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.col_dual,sVar5);
    }
    if (row_dual != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.row_dual,__new_size);
    }
  }
  if (0 < iVar1) {
    sVar4 = 0;
    do {
      if (col_value != (double *)0x0) {
        local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar4] = col_value[sVar4];
      }
      if (col_dual != (double *)0x0) {
        local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar4] = col_dual[sVar4];
      }
      sVar4 = sVar4 + 1;
    } while (sVar5 != sVar4);
  }
  if (0 < iVar2 && row_dual != (double *)0x0) {
    sVar5 = 0;
    do {
      local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar5] = row_dual[sVar5];
      sVar5 = sVar5 + 1;
    } while (__new_size != sVar5);
  }
  HVar3 = Highs::postsolve((Highs *)highs,&local_98);
  if (local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar3;
}

Assistant:

HighsInt Highs_postsolve(void* highs, const double* col_value,
                         const double* col_dual, const double* row_dual) {
  const HighsLp& presolved_lp = ((Highs*)highs)->getPresolvedLp();
  HighsInt num_col = presolved_lp.num_col_;
  HighsInt num_row = presolved_lp.num_row_;
  // Create a HighsSolution from what's been passed
  HighsSolution solution;
  if (col_value) {
    solution.value_valid = true;
    solution.col_value.resize(num_col);
    // No need for primal row values, but resize the vector for later
    // use
    solution.row_value.resize(num_row);
  }
  if (col_dual || row_dual) {
    // If column or row duals are passed, assume that they are
    // valid. If either is a null pointer, then the corresponding
    // vector will have no data, and the size check will fail
    solution.dual_valid = true;
    if (col_dual) solution.col_dual.resize(num_col);
    if (row_dual) solution.row_dual.resize(num_row);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (col_value) solution.col_value[iCol] = col_value[iCol];
    if (col_dual) solution.col_dual[iCol] = col_dual[iCol];
  }
  if (row_dual) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      solution.row_dual[iRow] = row_dual[iRow];
  }
  return (HighsInt)((Highs*)highs)->postsolve(solution);
}